

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_ByteDataConstructor_Test::~ByteData160_ByteDataConstructor_Test
          (ByteData160_ByteDataConstructor_Test *this)

{
  ByteData160_ByteDataConstructor_Test *this_local;
  
  ~ByteData160_ByteDataConstructor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, ByteDataConstructor) {
  ByteData data("1234567890123456789012345678901234567890");
  ByteData160 byte_data = ByteData160(data);

  EXPECT_STREQ(byte_data.GetHex().c_str(), data.GetHex().c_str());
  EXPECT_FALSE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "141234567890123456789012345678901234567890");
  ByteData byte_class_data;
  EXPECT_NO_THROW(byte_class_data = byte_data.GetData());
  EXPECT_EQ(byte_data.GetBytes(), byte_class_data.GetBytes());
}